

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

int Abc_NtkDarBmc(Abc_Ntk_t *pNtk,int nStart,int nFrames,int nSizeMax,int nNodeDelta,int nTimeOut,
                 int nBTLimit,int nBTLimitAll,int fRewrite,int fNewAlgo,int fOrDecomp,int nCofFanLit
                 ,int fVerbose,int *piFrames,int fUseSatoko)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  abctime aVar6;
  long local_80;
  Abc_Cex_t *pCex;
  long lStack_68;
  int iFrame;
  abctime nTimeLimit;
  abctime clk;
  int RetValue;
  int status;
  Vec_Int_t *vMap;
  Aig_Man_t *pMan;
  int local_38;
  int nTimeOut_local;
  int nNodeDelta_local;
  int nSizeMax_local;
  int nFrames_local;
  int nStart_local;
  Abc_Ntk_t *pNtk_local;
  
  _RetValue = (Vec_Int_t *)0x0;
  clk._0_4_ = -1;
  pMan._4_4_ = nTimeOut;
  local_38 = nNodeDelta;
  nTimeOut_local = nSizeMax;
  nNodeDelta_local = nFrames;
  nSizeMax_local = nStart;
  _nFrames_local = pNtk;
  nTimeLimit = Abc_Clock();
  if (pMan._4_4_ == 0) {
    local_80 = 0;
  }
  else {
    lVar5 = (long)pMan._4_4_;
    aVar6 = Abc_Clock();
    local_80 = lVar5 * 1000000 + aVar6;
  }
  lStack_68 = local_80;
  if (fOrDecomp == 0) {
    vMap = (Vec_Int_t *)Abc_NtkToDar(_nFrames_local,0,1);
  }
  else {
    vMap = (Vec_Int_t *)Abc_NtkToDarBmc(_nFrames_local,(Vec_Int_t **)&RetValue);
  }
  if (vMap == (Vec_Int_t *)0x0) {
    Abc_Print(1,"Converting miter into AIG has failed.\n");
    pNtk_local._4_4_ = (int)clk;
  }
  else {
    if (*(int *)&vMap[6].pArray < 1) {
      __assert_fail("pMan->nRegs > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                    ,0x923,
                    "int Abc_NtkDarBmc(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int, int, int, int, int *, int)"
                   );
    }
    if (_RetValue != (Vec_Int_t *)0x0) {
      iVar1 = Vec_IntSize(_RetValue);
      iVar2 = Saig_ManPoNum((Aig_Man_t *)vMap);
      if (iVar1 != iVar2) {
        __assert_fail("vMap == NULL || Vec_IntSize(vMap) == Saig_ManPoNum(pMan)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                      ,0x924,
                      "int Abc_NtkDarBmc(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int, int, int, int, int *, int)"
                     );
      }
    }
    if ((fVerbose != 0) && (_RetValue != (Vec_Int_t *)0x0)) {
      iVar1 = Abc_NtkPoNum(_nFrames_local);
      iVar2 = Saig_ManPoNum((Aig_Man_t *)vMap);
      if (iVar1 != iVar2) {
        uVar3 = Abc_NtkPoNum(_nFrames_local);
        uVar4 = Saig_ManPoNum((Aig_Man_t *)vMap);
        Abc_Print(1,"Expanded %d outputs into %d outputs using OR decomposition.\n",(ulong)uVar3,
                  (ulong)uVar4);
      }
    }
    if (fNewAlgo == 0) {
      clk._0_4_ = Saig_BmcPerform((Aig_Man_t *)vMap,nSizeMax_local,nNodeDelta_local,local_38,
                                  pMan._4_4_,nBTLimit,nBTLimitAll,fVerbose,0,piFrames,0,fUseSatoko);
      if (_nFrames_local->pModel != (int *)0x0) {
        free(_nFrames_local->pModel);
        _nFrames_local->pModel = (int *)0x0;
      }
      if (_nFrames_local->pSeqModel != (Abc_Cex_t *)0x0) {
        free(_nFrames_local->pSeqModel);
        _nFrames_local->pSeqModel = (Abc_Cex_t *)0x0;
      }
      _nFrames_local->pSeqModel = (Abc_Cex_t *)vMap[0x19].pArray;
      vMap[0x19].pArray = (int *)0x0;
    }
    else {
      clk._0_4_ = Saig_ManBmcSimple((Aig_Man_t *)vMap,nNodeDelta_local,nTimeOut_local,nBTLimit,
                                    fRewrite,fVerbose,(int *)((long)&pCex + 4),nCofFanLit,fUseSatoko
                                   );
      if (piFrames != (int *)0x0) {
        *piFrames = pCex._4_4_;
      }
      if (_nFrames_local->pModel != (int *)0x0) {
        free(_nFrames_local->pModel);
        _nFrames_local->pModel = (int *)0x0;
      }
      if (_nFrames_local->pSeqModel != (Abc_Cex_t *)0x0) {
        free(_nFrames_local->pSeqModel);
        _nFrames_local->pSeqModel = (Abc_Cex_t *)0x0;
      }
      _nFrames_local->pSeqModel = (Abc_Cex_t *)vMap[0x19].pArray;
      vMap[0x19].pArray = (int *)0x0;
      if ((int)clk == 1) {
        Abc_Print(1,"Incorrect return value.  ");
      }
      else if ((int)clk == -1) {
        uVar3 = Abc_MaxInt(pCex._4_4_ + 1,0);
        Abc_Print(1,"No output asserted in %d frames. Resource limit reached ",(ulong)uVar3);
        if ((lStack_68 == 0) || (aVar6 = Abc_Clock(), aVar6 <= lStack_68)) {
          Abc_Print(1,"(conf limit %d). ",(ulong)(uint)nBTLimit);
        }
        else {
          Abc_Print(1,"(timeout %d sec). ",lStack_68);
        }
      }
      else {
        Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d. ",
                  (ulong)(uint)_nFrames_local->pSeqModel->iPo,_nFrames_local->pName,
                  (ulong)(uint)_nFrames_local->pSeqModel->iFrame);
      }
      Abc_Print(1,"%s =","Time");
      aVar6 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - nTimeLimit) * 1.0) / 1000000.0);
    }
    if ((_nFrames_local->pSeqModel != (Abc_Cex_t *)0x0) &&
       (clk._4_4_ = Saig_ManVerifyCex((Aig_Man_t *)vMap,_nFrames_local->pSeqModel), clk._4_4_ == 0))
    {
      Abc_Print(1,"Abc_NtkDarBmc(): Counter-example verification has FAILED.\n");
    }
    Aig_ManStop((Aig_Man_t *)vMap);
    if ((_nFrames_local->pSeqModel != (Abc_Cex_t *)0x0) && (_RetValue != (Vec_Int_t *)0x0)) {
      iVar1 = Vec_IntEntry(_RetValue,_nFrames_local->pSeqModel->iPo);
      _nFrames_local->pSeqModel->iPo = iVar1;
    }
    Vec_IntFreeP((Vec_Int_t **)&RetValue);
    pNtk_local._4_4_ = (int)clk;
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkDarBmc( Abc_Ntk_t * pNtk, int nStart, int nFrames, int nSizeMax, int nNodeDelta, int nTimeOut, int nBTLimit, int nBTLimitAll, int fRewrite, int fNewAlgo, int fOrDecomp, int nCofFanLit, int fVerbose, int * piFrames, int fUseSatoko )
{
    Aig_Man_t * pMan;
    Vec_Int_t * vMap = NULL;
    int status, RetValue = -1;
    abctime clk = Abc_Clock();
    abctime nTimeLimit = nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    // derive the AIG manager
    if ( fOrDecomp )
        pMan = Abc_NtkToDarBmc( pNtk, &vMap );
    else
        pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return RetValue;
    }
    assert( pMan->nRegs > 0 );
    assert( vMap == NULL || Vec_IntSize(vMap) == Saig_ManPoNum(pMan) );
    if ( fVerbose && vMap && Abc_NtkPoNum(pNtk) != Saig_ManPoNum(pMan) ) 
        Abc_Print( 1, "Expanded %d outputs into %d outputs using OR decomposition.\n", Abc_NtkPoNum(pNtk), Saig_ManPoNum(pMan) );

    // perform verification
    if ( fNewAlgo ) // command 'bmc'
    {
        int iFrame;
        RetValue = Saig_ManBmcSimple( pMan, nFrames, nSizeMax, nBTLimit, fRewrite, fVerbose, &iFrame, nCofFanLit, fUseSatoko );
        if ( piFrames )
            *piFrames = iFrame;
        ABC_FREE( pNtk->pModel );
        ABC_FREE( pNtk->pSeqModel );
        pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
        if ( RetValue == 1 )
            Abc_Print( 1, "Incorrect return value.  " );
        else if ( RetValue == -1 )
        {
            Abc_Print( 1, "No output asserted in %d frames. Resource limit reached ", Abc_MaxInt(iFrame+1,0) );
            if ( nTimeLimit && Abc_Clock() > nTimeLimit )
                Abc_Print( 1, "(timeout %d sec). ", nTimeLimit );
            else
                Abc_Print( 1, "(conf limit %d). ", nBTLimit );
        }
        else // if ( RetValue == 0 )
        {
            Abc_Cex_t * pCex = pNtk->pSeqModel;
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. ", pCex->iPo, pNtk->pName, pCex->iFrame );
        }
ABC_PRT( "Time", Abc_Clock() - clk );
    }
    else
    { 
        RetValue = Saig_BmcPerform( pMan, nStart, nFrames, nNodeDelta, nTimeOut, nBTLimit, nBTLimitAll, fVerbose, 0, piFrames, 0, fUseSatoko );
        ABC_FREE( pNtk->pModel );
        ABC_FREE( pNtk->pSeqModel );
        pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
    }
    // verify counter-example
    if ( pNtk->pSeqModel ) 
    {
        status = Saig_ManVerifyCex( pMan, pNtk->pSeqModel );
        if ( status == 0 )
            Abc_Print( 1, "Abc_NtkDarBmc(): Counter-example verification has FAILED.\n" );
    }
    Aig_ManStop( pMan );
    // update the counter-example
    if ( pNtk->pSeqModel && vMap )
        pNtk->pSeqModel->iPo = Vec_IntEntry( vMap, pNtk->pSeqModel->iPo );
    Vec_IntFreeP( &vMap );
    return RetValue;
}